

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psf_file.cpp
# Opt level: O0

void __thiscall PSFFile::PSFFile(PSFFile *this,string *filename)

{
  bool bVar1;
  char *path;
  ulong uVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  long lVar5;
  string *psVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  pointer ppVar10;
  __type local_1859;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1618;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_15e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_15d8;
  const_iterator local_1598;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_1590;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_1588;
  iterator it;
  string value;
  key_type local_1560 [8];
  string key;
  ulong local_1540;
  size_t value_end_offset;
  size_t value_start_offset;
  size_t name_end_offset;
  size_t name_start_offset;
  size_t tag_separator_offset;
  string tag_line;
  ulong local_14f0;
  size_t tag_end_offset;
  size_t tag_start_offset;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  string local_14a0 [32];
  ostringstream local_1480 [8];
  ostringstream message_buffer_10;
  allocator local_1301;
  string local_1300 [8];
  string tag_string;
  size_t tag_size;
  string local_12d0 [8];
  string tag_marker;
  string local_12a8 [32];
  ostringstream local_1288 [8];
  ostringstream message_buffer_9;
  string local_1108 [32];
  ostringstream local_10e8 [8];
  ostringstream message_buffer_8;
  string local_f68 [32];
  ostringstream local_f48 [8];
  ostringstream message_buffer_7;
  size_t psf_mandatory_size;
  string local_dc0 [32];
  ostringstream local_da0 [8];
  ostringstream message_buffer_6;
  uint32_t local_c28;
  undefined1 local_c21;
  uint32_t compressed_exe_crc32;
  ostringstream local_c00 [8];
  ostringstream message_buffer_5;
  uint local_a88;
  undefined1 local_a81;
  uint32_t compressed_exe_size;
  ostringstream local_a60 [8];
  ostringstream message_buffer_4;
  uint local_8e8;
  undefined1 local_8e1;
  uint32_t reserved_size;
  ostringstream local_8c0 [8];
  ostringstream message_buffer_3;
  uint8_t local_742 [2];
  string local_740 [6];
  uint8_t version;
  ostringstream local_720 [8];
  ostringstream message_buffer_2;
  string local_5a0 [32];
  ostringstream local_580 [8];
  ostringstream message_buffer_1;
  allocator local_401;
  string local_400 [8];
  string signature;
  long local_3e0;
  ifstream in;
  uintmax_t psf_size;
  string local_1c8 [32];
  ostringstream local_1a8 [8];
  ostringstream message_buffer;
  off_t filesize;
  string *filename_local;
  PSFFile *this_local;
  
  this->_vptr_PSFFile = (_func_int **)&PTR__PSFFile_0011ed18;
  std::__cxx11::string::string((string *)&this->reserved_);
  std::__cxx11::string::string((string *)&this->compressed_exe_);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->tags_);
  path = (char *)std::__cxx11::string::c_str();
  uVar2 = path_getfilesize(path);
  if (uVar2 == 0xffffffffffffffff) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = std::operator<<((ostream *)local_1a8,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"File not exists.");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1c8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::ifstream(&local_3e0);
  std::ios::exceptions((int)&local_3e0 + (int)*(undefined8 *)(local_3e0 + -0x18));
  std::ifstream::open((string *)&local_3e0,(_Ios_Openmode)filename);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,3,'\0',&local_401);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  lVar5 = std::__cxx11::string::operator[]((ulong)local_400);
  std::istream::read((char *)&local_3e0,lVar5);
  lVar5 = std::istream::gcount();
  if (lVar5 != 3) {
    std::__cxx11::ostringstream::ostringstream(local_580);
    poVar3 = std::operator<<((ostream *)local_580,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Unable to read the PSF signature.");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_5a0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_400,"PSF");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_720);
    poVar3 = std::operator<<((ostream *)local_720,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Invalid PSF signature. ");
    local_742[1] = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_740);
    local_742[1] = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = ReadStreamAsInt8<std::ifstream,unsigned_char>
                    ((basic_ifstream<char,_std::char_traits<char>_> *)&local_3e0,local_742);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_8c0);
    poVar3 = std::operator<<((ostream *)local_8c0,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Unable to read the version byte.");
    local_8e1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,(string *)&reserved_size);
    local_8e1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = ReadStreamAsInt32L<std::ifstream,unsigned_int>
                    ((basic_ifstream<char,_std::char_traits<char>_> *)&local_3e0,&local_8e8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_a60);
    poVar3 = std::operator<<((ostream *)local_a60,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Unable to read the size of reserved area.");
    local_a81 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,(string *)&compressed_exe_size);
    local_a81 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = ReadStreamAsInt32L<std::ifstream,unsigned_int>
                    ((basic_ifstream<char,_std::char_traits<char>_> *)&local_3e0,&local_a88);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_c00);
    poVar3 = std::operator<<((ostream *)local_c00,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Unable to read the size of compressed program.");
    local_c21 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,(string *)&compressed_exe_crc32);
    local_c21 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = ReadStreamAsInt32L<std::ifstream,unsigned_int>
                    ((basic_ifstream<char,_std::char_traits<char>_> *)&local_3e0,&local_c28);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_da0);
    poVar3 = std::operator<<((ostream *)local_da0,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Unable to read the CRC32 of compressed program.");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_dc0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar8 = (ulong)(local_8e8 + 0x10 + local_a88);
  if (uVar2 < uVar8) {
    std::__cxx11::ostringstream::ostringstream(local_f48);
    poVar3 = std::operator<<((ostream *)local_f48,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"File is too short than expected.");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_f68);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  set_version(this,local_742[0]);
  psVar6 = reserved_abi_cxx11_(this);
  std::__cxx11::string::resize((ulong)psVar6);
  psVar6 = reserved_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::operator[]((ulong)psVar6);
  std::istream::read((char *)&local_3e0,lVar5);
  uVar7 = std::istream::gcount();
  if (uVar7 != local_8e8) {
    std::__cxx11::ostringstream::ostringstream(local_10e8);
    poVar3 = std::operator<<((ostream *)local_10e8,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Unable to read the reserved area.");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1108);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar6 = compressed_exe_abi_cxx11_(this);
  std::__cxx11::string::resize((ulong)psVar6);
  psVar6 = compressed_exe_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::operator[]((ulong)psVar6);
  std::istream::read((char *)&local_3e0,lVar5);
  uVar7 = std::istream::gcount();
  if (uVar7 != local_a88) {
    std::__cxx11::ostringstream::ostringstream(local_1288);
    poVar3 = std::operator<<((ostream *)local_1288,(string *)filename);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Unable to read the compressed program.");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_12a8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  set_compressed_exe_crc32(this,local_c28);
  if (uVar8 + 5 <= uVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_12d0,5,'\0',(allocator *)((long)&tag_size + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&tag_size + 7));
    lVar5 = std::__cxx11::string::operator[]((ulong)local_12d0);
    std::istream::read((char *)&local_3e0,lVar5);
    lVar5 = std::istream::gcount();
    if ((lVar5 == 5) &&
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_12d0,"[TAG]"), bVar1)) {
      uVar2 = uVar2 - (local_8e8 + 0x15 + local_a88);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1300,uVar2,'\0',&local_1301);
      std::allocator<char>::~allocator((allocator<char> *)&local_1301);
      lVar5 = std::__cxx11::string::operator[]((ulong)local_1300);
      std::istream::read((char *)&local_3e0,lVar5);
      uVar8 = std::istream::gcount();
      if (uVar8 != uVar2) {
        std::__cxx11::ostringstream::ostringstream(local_1480);
        poVar3 = std::operator<<((ostream *)local_1480,(string *)filename);
        poVar3 = std::operator<<(poVar3,": ");
        std::operator<<(poVar3,"Unable to read the tag area.");
        tags._M_h._M_single_bucket._7_1_ = 1;
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar4,local_14a0);
        tags._M_h._M_single_bucket._7_1_ = 0;
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&tag_start_offset);
      tag_end_offset = 0;
      while (uVar2 = std::__cxx11::string::size(), tag_end_offset < uVar2) {
        local_14f0 = std::__cxx11::string::find((char *)local_1300,0x119426);
        if (local_14f0 == 0xffffffffffffffff) {
          local_14f0 = std::__cxx11::string::size();
        }
        std::__cxx11::string::substr((ulong)&tag_separator_offset,(ulong)local_1300);
        lVar5 = std::__cxx11::string::find((char *)&tag_separator_offset,0x119144);
        if (lVar5 != -1) {
          value_start_offset = tag_end_offset + lVar5;
          name_end_offset = tag_end_offset;
          value_end_offset = value_start_offset + 1;
          local_1540 = local_14f0;
          while( true ) {
            bVar1 = false;
            if (tag_end_offset < value_start_offset) {
              pbVar9 = (byte *)std::__cxx11::string::operator[]((ulong)local_1300);
              bVar1 = *pbVar9 < 0x21;
            }
            if (!bVar1) break;
            value_start_offset = value_start_offset - 1;
          }
          while( true ) {
            bVar1 = false;
            if (value_end_offset < local_1540) {
              pbVar9 = (byte *)std::__cxx11::string::operator[]((ulong)local_1300);
              bVar1 = *pbVar9 < 0x21;
            }
            if (!bVar1) break;
            local_1540 = local_1540 - 1;
          }
          while( true ) {
            bVar1 = false;
            if (name_end_offset < value_start_offset) {
              pbVar9 = (byte *)std::__cxx11::string::operator[]((ulong)local_1300);
              bVar1 = *pbVar9 < 0x21;
            }
            if (!bVar1) break;
            name_end_offset = name_end_offset + 1;
          }
          while( true ) {
            bVar1 = false;
            if (value_end_offset < local_1540) {
              pbVar9 = (byte *)std::__cxx11::string::operator[]((ulong)local_1300);
              bVar1 = *pbVar9 < 0x21;
            }
            if (!bVar1) break;
            value_end_offset = value_end_offset + 1;
          }
          std::__cxx11::string::substr((ulong)local_1560,(ulong)local_1300);
          std::__cxx11::string::substr((ulong)&it,(ulong)local_1300);
          local_1588._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&tag_start_offset,local_1560);
          local_1590._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&tag_start_offset);
          bVar1 = std::__detail::operator!=(&local_1588,&local_1590);
          local_1859 = false;
          if (bVar1) {
            ppVar10 = std::__detail::
                      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                    *)&local_1588);
            local_1859 = std::operator==(&ppVar10->first,local_1560);
          }
          if (local_1859 == false) {
            std::__detail::
            _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
            ::_Node_const_iterator
                      (&local_1598,
                       (_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                        *)&local_1588);
            std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
                      (&local_15d8,local_1560,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
            local_15e0._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                           ((unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                             *)&tag_start_offset,local_1598,&local_15d8);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(&local_15d8);
          }
          else {
            ppVar10 = std::__detail::
                      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                    *)&local_1588);
            std::__cxx11::string::operator+=((string *)&ppVar10->second,"\n");
            ppVar10 = std::__detail::
                      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                    *)&local_1588);
            std::__cxx11::string::operator+=((string *)&ppVar10->second,(string *)&it);
          }
          std::__cxx11::string::~string((string *)&it);
          std::__cxx11::string::~string((string *)local_1560);
        }
        tag_end_offset = local_14f0 + 1;
        std::__cxx11::string::~string((string *)&tag_separator_offset);
      }
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unordered_map(&local_1618,
                      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&tag_start_offset);
      set_tags(this,&local_1618);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~unordered_map(&local_1618);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&tag_start_offset);
      std::__cxx11::string::~string(local_1300);
    }
    std::__cxx11::string::~string(local_12d0);
  }
  std::__cxx11::string::~string(local_400);
  std::ifstream::~ifstream(&local_3e0);
  return;
}

Assistant:

PSFFile::PSFFile(const std::string & filename) {
  // get input file size
  off_t filesize = path_getfilesize(filename.c_str());
  if (filesize == -1) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "File not exists.";
    throw std::runtime_error(message_buffer.str());
  }
  std::uintmax_t psf_size = static_cast<std::uintmax_t>(filesize);

  // open input file
  std::ifstream in;
  in.exceptions(std::ios::badbit);
  in.open(filename, std::ios::binary);

  // check signature
  std::string signature(kPSFSignatureSize, 0);
  in.read(&signature[0], kPSFSignatureSize);
  if (in.gcount() != kPSFSignatureSize) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the PSF signature.";
    throw std::runtime_error(message_buffer.str());
  }
  if (signature != kPSFSignature) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Invalid PSF signature. ";
    throw std::runtime_error(message_buffer.str());
  }

  // read the version byte
  uint8_t version;
  if (!ReadStreamAsInt8(in, version)) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the version byte.";
    throw std::runtime_error(message_buffer.str());
  }

  // read the size of reserved area
  uint32_t reserved_size;
  if (!ReadStreamAsInt32L(in, reserved_size)) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the size of reserved area.";
    throw std::runtime_error(message_buffer.str());
  }

  // read the size of compressed program
  uint32_t compressed_exe_size;
  if (!ReadStreamAsInt32L(in, compressed_exe_size)) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the size of compressed program.";
    throw std::runtime_error(message_buffer.str());
  }

  // crc32 of compressed program
  uint32_t compressed_exe_crc32;
  if (!ReadStreamAsInt32L(in, compressed_exe_crc32)) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the CRC32 of compressed program.";
    throw std::runtime_error(message_buffer.str());
  }

  // check the size consistency
  size_t psf_mandatory_size = 0x10 + reserved_size + compressed_exe_size;
  if (psf_mandatory_size > psf_size) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "File is too short than expected.";
    throw std::runtime_error(message_buffer.str());
  }

  // set the version byte
  set_version(version);

  // read the reserved area
  reserved().resize(reserved_size);
  in.read(&reserved()[0], reserved_size);
  if (in.gcount() != reserved_size) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the reserved area.";
    throw std::runtime_error(message_buffer.str());
  }

  // read the compressed program
  compressed_exe().resize(compressed_exe_size);
  in.read(&compressed_exe()[0], compressed_exe_size);
  if (in.gcount() != compressed_exe_size) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the compressed program.";
    throw std::runtime_error(message_buffer.str());
  }

  // set the CRC32 of the compressed program
  set_compressed_exe_crc32(compressed_exe_crc32);

  // check the tag marker (optional area)
  if (psf_mandatory_size + kPSFTagMarkerSize <= psf_size) {
    std::string tag_marker(kPSFTagMarkerSize, 0);
    in.read(&tag_marker[0], kPSFTagMarkerSize);
    if (in.gcount() == kPSFTagMarkerSize && tag_marker == kPSFTagMarker) {
      // read entire of the tag area
      size_t tag_size = (size_t)psf_size - (0x10 + reserved_size + compressed_exe_size + kPSFTagMarkerSize);
      std::string tag_string(tag_size, 0);
      in.read(&tag_string[0], tag_size);
      if (in.gcount() != tag_size) {
        std::ostringstream message_buffer;
        message_buffer << filename << ": " << "Unable to read the tag area.";
        throw std::runtime_error(message_buffer.str());
      }

      // Parse tag section. Details are available here:
      // http://wiki.neillcorlett.com/PSFTagFormat
      std::unordered_map<std::string, std::string> tags;
      size_t tag_start_offset = 0;
      while (tag_start_offset < tag_string.size()) {
        // Search the end position of the current line.
        size_t tag_end_offset = tag_string.find("\n", tag_start_offset);
        if (tag_end_offset == std::string::npos) {
          // Tag section must end with a newline.
          // Read the all remaining bytes if a newline lacks though.
          tag_end_offset = tag_string.size();
        }

        // Search the variable=value separator.
        std::string tag_line = tag_string.substr(tag_start_offset, tag_end_offset - tag_start_offset);
        size_t tag_separator_offset = tag_line.find("=", 0);
        if (tag_separator_offset == std::string::npos) {
          // Blank lines, or lines not of the form "variable=value", are ignored.
          tag_start_offset = tag_end_offset + 1;
          continue;
        }
        tag_separator_offset += tag_start_offset;

        // Determine the start/end position of variable.
        size_t name_start_offset = tag_start_offset;
        size_t name_end_offset = tag_separator_offset;
        size_t value_start_offset = tag_separator_offset + 1;
        size_t value_end_offset = tag_end_offset;

        // Whitespace at the beginning/end of the line and before/after the = are ignored.
        // All characters 0x01-0x20 are considered whitespace.
        // (There must be no null (0x00) characters.)
        // Trim them.
        while (name_end_offset > name_start_offset && static_cast<unsigned char>(tag_string[name_end_offset - 1]) <= 0x20) {
          name_end_offset--;
        }
        while (value_end_offset > value_start_offset && static_cast<unsigned char>(tag_string[value_end_offset - 1]) <= 0x20) {
          value_end_offset--;
        }
        while (name_start_offset < name_end_offset && static_cast<unsigned char>(tag_string[name_start_offset]) <= 0x20) {
          name_start_offset++;
        }
        while (value_start_offset < value_end_offset && static_cast<unsigned char>(tag_string[value_start_offset]) <= 0x20) {
          value_start_offset++;
        }

        // Read variable=value as string.
        std::string key = tag_string.substr(name_start_offset, name_end_offset - name_start_offset);
        std::string value = tag_string.substr(value_start_offset, value_end_offset - value_start_offset);

        // Multiple-line variables must appear as consecutive lines using the same variable name.
        // For instance:
        //   comment=This is a
        //   comment=multiple-line
        //   comment=comment.
        // Therefore, check if the variable had already appeared.
        std::unordered_map<std::string, std::string>::iterator it = tags.find(key);
        if (it != tags.end() && it->first == key) {
          it->second += "\n";
          it->second += value;
        }
        else {
          tags.insert(it, std::make_pair(key, value));
        }

        // parse next line
        tag_start_offset = tag_end_offset + 1;
      }

      set_tags(std::move(tags));
    }
  }
}